

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.h
# Opt level: O3

int fiobj_iseq(FIOBJ o,FIOBJ o2)

{
  char cVar1;
  int iVar2;
  fiobj_object_vtable_s *pfVar3;
  size_t sVar4;
  uintptr_t uVar5;
  char *pcVar6;
  uint uVar7;
  
  if (o == o2) {
    return 1;
  }
  if (o2 == 0) {
    return 0;
  }
  if ((~(uint)o2 & 6) == 0) {
    return 0;
  }
  uVar7 = (uint)o & 6;
  if (uVar7 == 6) {
    return 0;
  }
  if ((((uint)o2 | (uint)o) & 1) != 0) {
    return 0;
  }
  pcVar6 = (char *)(o & 0xfffffffffffffff8);
  if (*pcVar6 != *(char *)(o2 & 0xfffffffffffffff8)) {
    return 0;
  }
  if ((o & 6) == 0) {
    switch(*pcVar6) {
    case '\'':
      pfVar3 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case '(':
      goto switchD_00124678_caseD_28;
    case ')':
      pfVar3 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case '*':
      goto switchD_00124678_caseD_2a;
    case '+':
      pfVar3 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar3 = &FIOBJECT_VTABLE_NUMBER;
    }
  }
  else if (uVar7 == 2) {
switchD_00124678_caseD_28:
    pfVar3 = &FIOBJECT_VTABLE_STRING;
  }
  else {
switchD_00124678_caseD_2a:
    pfVar3 = &FIOBJECT_VTABLE_HASH;
  }
  sVar4 = (*pfVar3->is_eq)(o,o2);
  if (sVar4 == 0) {
    return 0;
  }
  if ((o & 6) == 0) {
    switch(*pcVar6) {
    case '\'':
      pfVar3 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case '(':
      goto switchD_001246cf_caseD_28;
    case ')':
      pfVar3 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case '*':
      goto switchD_001246cf_caseD_2a;
    case '+':
      pfVar3 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar3 = &FIOBJECT_VTABLE_NUMBER;
    }
  }
  else if (uVar7 == 2) {
switchD_001246cf_caseD_28:
    pfVar3 = &FIOBJECT_VTABLE_STRING;
  }
  else {
switchD_001246cf_caseD_2a:
    pfVar3 = &FIOBJECT_VTABLE_HASH;
  }
  if (pfVar3->each == (_func_size_t_FIOBJ_size_t__func_int_FIOBJ_void_ptr_ptr_void_ptr *)0x0) {
    return 1;
  }
  switch(uVar7) {
  case 0:
    cVar1 = *pcVar6;
    break;
  case 2:
    goto switchD_001246fa_caseD_2;
  case 4:
    goto switchD_001246fa_caseD_4;
  case 6:
    cVar1 = (char)o;
  }
  switch(cVar1) {
  case '\'':
    pfVar3 = &FIOBJECT_VTABLE_FLOAT;
    break;
  case '(':
switchD_001246fa_caseD_2:
    pfVar3 = &FIOBJECT_VTABLE_STRING;
    break;
  case ')':
    pfVar3 = &FIOBJECT_VTABLE_ARRAY;
    break;
  case '*':
switchD_001246fa_caseD_4:
    pfVar3 = &FIOBJECT_VTABLE_HASH;
    break;
  case '+':
    pfVar3 = &FIOBJECT_VTABLE_DATA;
    break;
  default:
    pfVar3 = &FIOBJECT_VTABLE_NUMBER;
  }
  uVar5 = (*pfVar3->count)(o);
  if (uVar5 != 0) {
    iVar2 = fiobj_iseq____internal_complex__(o,o2);
    return iVar2;
  }
  return 1;
}

Assistant:

FIO_INLINE int fiobj_iseq(const FIOBJ o, const FIOBJ o2) {
  if (o == o2)
    return 1;
  if (!o || !o2)
    return 0; /* they should have compared equal before. */
  if (!FIOBJ_IS_ALLOCATED(o) || !FIOBJ_IS_ALLOCATED(o2))
    return 0; /* they should have compared equal before. */
  if (FIOBJECT2HEAD(o)->type != FIOBJECT2HEAD(o2)->type)
    return 0; /* non-type equality is a barriar to equality. */
  if (!FIOBJECT2VTBL(o)->is_eq(o, o2))
    return 0;
  if (FIOBJECT2VTBL(o)->each && FIOBJECT2VTBL(o)->count(o))
    return fiobj_iseq____internal_complex__((FIOBJ)o, (FIOBJ)o2);
  return 1;
}